

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

void lj_ffh_coroutine_wrap_err(lua_State *L,lua_State *co)

{
  lua_State *L_00;
  long in_RSI;
  char *in_RDI;
  
  *(long *)(in_RSI + 0x18) = *(long *)(in_RSI + 0x18) + -8;
  L_00 = *(lua_State **)(in_RSI + 0x18);
  **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)L_00;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 8;
  if (*(int *)(*(long *)(in_RDI + 0x18) + -4) == -5) {
    lj_err_callermsg(L_00,in_RDI);
  }
  lj_err_run((lua_State *)"copy of dead GC object");
}

Assistant:

void LJ_FASTCALL lj_ffh_coroutine_wrap_err(lua_State *L, lua_State *co)
{
  co->top--; copyTV(L, L->top, co->top); L->top++;
  if (tvisstr(L->top-1))
    lj_err_callermsg(L, strVdata(L->top-1));
  else
    lj_err_run(L);
}